

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_test.cc
# Opt level: O3

void __thiscall
prometheus::anon_unknown_0::SummaryTest_max_age_Test::TestBody(SummaryTest_max_age_Test *this)

{
  int iVar1;
  int *piVar2;
  initializer_list<prometheus::detail::CKMSQuantiles::Quantile> __l;
  Summary summary;
  allocator_type local_c9;
  vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  local_c8;
  Quantile local_b0;
  Summary local_90;
  
  detail::CKMSQuantiles::Quantile::Quantile(&local_b0,0.99,0.001);
  __l._M_len = 1;
  __l._M_array = &local_b0;
  std::
  vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  ::vector(&local_c8,__l,&local_c9);
  Summary::Summary(&local_90,&local_c8,(milliseconds)0x3e8,2);
  if (local_c8.
      super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  Summary::Observe(&local_90,8.0);
  TestBody::anon_class_8_1_14a0da86::operator()((anon_class_8_1_14a0da86 *)&local_90,8.0);
  local_b0.quantile = 0.0;
  local_b0.error = 2.96439387504748e-315;
  do {
    iVar1 = nanosleep((timespec *)&local_b0,(timespec *)&local_b0);
    if (iVar1 != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  TestBody::anon_class_8_1_14a0da86::operator()((anon_class_8_1_14a0da86 *)&local_90,8.0);
  local_b0.quantile = 0.0;
  local_b0.error = 2.96439387504748e-315;
  do {
    iVar1 = nanosleep((timespec *)&local_b0,(timespec *)&local_b0);
    if (iVar1 != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  TestBody::anon_class_8_1_14a0da86::operator()((anon_class_8_1_14a0da86 *)&local_90,NAN);
  std::vector<prometheus::detail::CKMSQuantiles,_std::allocator<prometheus::detail::CKMSQuantiles>_>
  ::~vector(&local_90.quantile_values_.ckms_quantiles_);
  if (local_90.quantiles_.
      super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.quantiles_.
                    super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(SummaryTest, max_age) {
  Summary summary{Summary::Quantiles{{0.99, 0.001}}, std::chrono::seconds(1),
                  2};
  summary.Observe(8.0);

  const auto test_value = [&summary](double ref) {
    auto metric = summary.Collect();
    auto s = metric.summary;
    ASSERT_EQ(s.quantile.size(), 1U);

    if (std::isnan(ref))
      EXPECT_TRUE(std::isnan(s.quantile.at(0).value));
    else
      EXPECT_DOUBLE_EQ(s.quantile.at(0).value, ref);
  };

  test_value(8.0);
  std::this_thread::sleep_for(std::chrono::milliseconds(600));
  test_value(8.0);
  std::this_thread::sleep_for(std::chrono::milliseconds(600));
  test_value(std::numeric_limits<double>::quiet_NaN());
}